

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall
AV1Kmeans::AV1KmeansTest1_CheckOutput_Test::TestBody(AV1KmeansTest1_CheckOutput_Test *this)

{
  int in_stack_000000c0;
  BLOCK_SIZE_conflict in_stack_000000c7;
  av1_calc_indices_dim1_func in_stack_000000c8;
  AV1KmeansTest1 *in_stack_000000d0;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec5d0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec5e4);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec607);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec61c);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec640);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec655);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec679);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec68e);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec6b2);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec6c7);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec6eb);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec700);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec724);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ec739);
  AV1KmeansTest1::RunCheckOutput
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c0);
  return;
}

Assistant:

TEST_P(AV1KmeansTest1, CheckOutput) {
  // centroids = 2..8
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 2);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 3);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 4);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 5);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 6);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 7);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 8);
}